

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfdcapi_elements_transaction_CreateRawTransaction_Test::TestBody
          (cfdcapi_elements_transaction_CreateRawTransaction_Test *this)

{
  AssertHelper AVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  int ret;
  AssertionResult gtest_ar;
  uint32_t index;
  char *tx_string2;
  void *handle;
  char *tx_string;
  AssertHelper local_78;
  AssertHelper local_70;
  int local_64;
  string local_60;
  uint32_t local_3c;
  AssertHelper local_38;
  void *local_30;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  
  local_30 = (void *)0x0;
  local_64 = CfdCreateHandle(&local_30);
  local_28.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((ulong)local_28.ptr_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_28,&local_64);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_28);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_._0_1_ = local_30 != (void *)0x0;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_30 == (void *)0x0) {
    testing::Message::Message((Message *)&local_38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_28,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x1f,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (local_38.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_38.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_38.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38.data_ = (AssertHelperData *)0x0;
  local_3c = 0;
  local_64 = CfdInitializeConfidentialTx(local_30,2,0,(char **)&local_28);
  local_78.data_ = (AssertHelperData *)((ulong)local_78.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_64);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x27,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_64 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_60,"\"0200000000000000000000\"","tx_string",
               "0200000000000000000000",(char *)local_28.ptr_);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x29,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_78.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_64 = CfdAddConfidentialTxIn
                         (local_30,(char *)local_28.ptr_,
                          "7461b02405414d79e79a5050684a333c922c1136f4bdff5fb94b551394edebbd",0,
                          0xffffffff,(char **)&local_38);
    local_78.data_ = local_78.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_64);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_78);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x2e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
      testing::internal::AssertHelper::~AssertHelper(&local_70);
      if (local_78.data_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_78.data_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_28.ptr_);
    AVar1.data_ = local_38.data_;
    local_28.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38.data_;
    local_38.data_ = (AssertHelperData *)0x0;
    if (local_64 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_60,
                 "\"020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000\""
                 ,"tx_string",
                 "020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000"
                 ,(char *)AVar1.data_);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x36,pcVar3);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_78.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_64 = CfdAddConfidentialTxIn
                           (local_30,(char *)local_28.ptr_,
                            "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1",1,
                            0xffffffff,(char **)&local_38);
      local_78.data_ = local_78.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_64);
      if ((char)local_60._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_78);
        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = *(char **)local_60._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_70,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x3b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
        testing::internal::AssertHelper::~AssertHelper(&local_70);
        if (local_78.data_ != (AssertHelperData *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_78.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_60._M_string_length,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      CfdFreeStringBuffer((char *)local_28.ptr_);
      AVar1.data_ = local_38.data_;
      local_28.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38.data_
      ;
      local_38.data_ = (AssertHelperData *)0x0;
      if (local_64 == 0) {
        testing::internal::CmpHelperSTREQ
                  ((internal *)&local_60,
                   "\"020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000\""
                   ,"tx_string",
                   "020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000"
                   ,(char *)AVar1.data_);
        if ((char)local_60._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_78);
          if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_60._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x43,pcVar3);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (local_78.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_60._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_64 = CfdAddConfidentialTxIn
                             (local_30,(char *)local_28.ptr_,
                              "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1",2,
                              0xffffffff,(char **)&local_38);
        local_78.data_ = local_78.data_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                  ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_64);
        if ((char)local_60._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_78);
          if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)local_60._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_70,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x48,pcVar3);
          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
          testing::internal::AssertHelper::~AssertHelper(&local_70);
          if (local_78.data_ != (AssertHelperData *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
              (**(code **)(*(long *)local_78.data_ + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&local_60._M_string_length,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        CfdFreeStringBuffer((char *)local_28.ptr_);
        AVar1.data_ = local_38.data_;
        local_28.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_38.data_;
        local_38.data_ = (AssertHelperData *)0x0;
        if (local_64 == 0) {
          testing::internal::CmpHelperSTREQ
                    ((internal *)&local_60,
                     "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000\""
                     ,"tx_string",
                     "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000"
                     ,(char *)AVar1.data_);
          if ((char)local_60._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_78);
            if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)local_60._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x50,pcVar3);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            if (local_78.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_78.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_3c = 0;
          local_64 = CfdGetConfidentialTxInIndex
                               (local_30,(char *)local_28.ptr_,
                                "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1",1
                                ,&local_3c);
          local_78.data_ = local_78.data_ & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                    ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_64);
          if ((char)local_60._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_78);
            if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)local_60._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x56,pcVar3);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            if (local_78.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_78.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          local_78.data_._0_4_ = 1;
          testing::internal::CmpHelperEQ<int,unsigned_int>
                    ((internal *)&local_60,"1","index",(int *)&local_78,&local_3c);
          if ((char)local_60._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_78);
            if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)local_60._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                       ,0x57,pcVar3);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            if (local_78.data_ != (AssertHelperData *)0x0) {
              bVar2 = testing::internal::IsTrue(true);
              if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                (**(code **)(*(long *)local_78.data_ + 8))();
              }
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60._M_string_length,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          if (local_64 == 0) {
            local_64 = CfdAddConfidentialTxOut
                                 (local_30,(char *)local_28.ptr_,
                                  "ef47c42d34de1b06a02212e8061323f50d5f02ceed202f1cb375932aa299f751"
                                  ,100000000,(char *)0x0,
                                  "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ"
                                  ,(char *)0x0,(char *)0x0,(char **)&local_38);
            local_78.data_ = local_78.data_ & 0xffffffff00000000;
            testing::internal::CmpHelperEQ<CfdErrorCode,int>
                      ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_64
                      );
            if ((char)local_60._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_78);
              if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)local_60._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_70,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                         ,0x60,pcVar3);
              testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
              testing::internal::AssertHelper::~AssertHelper(&local_70);
              if (local_78.data_ != (AssertHelperData *)0x0) {
                bVar2 = testing::internal::IsTrue(true);
                if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                  (**(code **)(*(long *)local_78.data_ + 8))();
                }
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_60._M_string_length,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            CfdFreeStringBuffer((char *)local_28.ptr_);
            AVar1.data_ = local_38.data_;
            local_28.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_38.data_;
            local_38.data_ = (AssertHelperData *)0x0;
            if (local_64 == 0) {
              testing::internal::CmpHelperSTREQ
                        ((internal *)&local_60,
                         "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000\""
                         ,"tx_string",
                         "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000"
                         ,(char *)AVar1.data_);
              if ((char)local_60._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_78);
                if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)local_60._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x68,pcVar3);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if (local_78.data_ != (AssertHelperData *)0x0) {
                  bVar2 = testing::internal::IsTrue(true);
                  if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_78.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_60._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              local_64 = CfdAddConfidentialTxOut
                                   (local_30,(char *)local_28.ptr_,
                                    "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3"
                                    ,0x71475420,(char *)0x0,"2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM",
                                    (char *)0x0,(char *)0x0,(char **)&local_38);
              local_78.data_ = local_78.data_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<CfdErrorCode,int>
                        ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,
                         &local_64);
              if ((char)local_60._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_78);
                if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                  pcVar3 = "";
                }
                else {
                  pcVar3 = *(char **)local_60._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_70,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                           ,0x6f,pcVar3);
                testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                testing::internal::AssertHelper::~AssertHelper(&local_70);
                if (local_78.data_ != (AssertHelperData *)0x0) {
                  bVar2 = testing::internal::IsTrue(true);
                  if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                    (**(code **)(*(long *)local_78.data_ + 8))();
                  }
                }
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_60._M_string_length,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              CfdFreeStringBuffer((char *)local_28.ptr_);
              AVar1.data_ = local_38.data_;
              local_28.ptr_ =
                   (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_38.data_;
              local_38.data_ = (AssertHelperData *)0x0;
              if (local_64 == 0) {
                testing::internal::CmpHelperSTREQ
                          ((internal *)&local_60,
                           "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000\""
                           ,"tx_string",
                           "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000"
                           ,(char *)AVar1.data_);
                if ((char)local_60._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_78);
                  if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = *(char **)local_60._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x77,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  if (local_78.data_ != (AssertHelperData *)0x0) {
                    bVar2 = testing::internal::IsTrue(true);
                    if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                      (**(code **)(*(long *)local_78.data_ + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_60._M_string_length,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                local_64 = CfdAddConfidentialTxOut
                                     (local_30,(char *)local_28.ptr_,
                                      "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3"
                                      ,500000,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
                                      (char **)&local_38);
                local_78.data_ = local_78.data_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<CfdErrorCode,int>
                          ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,
                           &local_64);
                if ((char)local_60._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_78);
                  if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                    pcVar3 = "";
                  }
                  else {
                    pcVar3 = *(char **)local_60._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_70,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                             ,0x7e,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                  testing::internal::AssertHelper::~AssertHelper(&local_70);
                  if (local_78.data_ != (AssertHelperData *)0x0) {
                    bVar2 = testing::internal::IsTrue(true);
                    if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                      (**(code **)(*(long *)local_78.data_ + 8))();
                    }
                  }
                }
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_60._M_string_length,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                CfdFreeStringBuffer((char *)local_28.ptr_);
                AVar1.data_ = local_38.data_;
                local_28.ptr_ =
                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_38.data_;
                local_38.data_ = (AssertHelperData *)0x0;
                if (local_64 == 0) {
                  local_64 = CfdGetConfidentialTxOutIndex
                                       (local_30,(char *)AVar1.data_,
                                        "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ"
                                        ,(char *)0x0,&local_3c);
                  local_78.data_ = local_78.data_ & 0xffffffff00000000;
                  testing::internal::CmpHelperEQ<CfdErrorCode,int>
                            ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,
                             &local_64);
                  if ((char)local_60._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_78);
                    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)local_60._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_70,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x89,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                    testing::internal::AssertHelper::~AssertHelper(&local_70);
                    if (local_78.data_ != (AssertHelperData *)0x0) {
                      bVar2 = testing::internal::IsTrue(true);
                      if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_78.data_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_60._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  local_78.data_ = local_78.data_ & 0xffffffff00000000;
                  testing::internal::CmpHelperEQ<int,unsigned_int>
                            ((internal *)&local_60,"0","index",(int *)&local_78,&local_3c);
                  if ((char)local_60._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_78);
                    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                      pcVar3 = "";
                    }
                    else {
                      pcVar3 = *(char **)local_60._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_70,kNonFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                               ,0x8a,pcVar3);
                    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                    testing::internal::AssertHelper::~AssertHelper(&local_70);
                    if (local_78.data_ != (AssertHelperData *)0x0) {
                      bVar2 = testing::internal::IsTrue(true);
                      if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                        (**(code **)(*(long *)local_78.data_ + 8))();
                      }
                    }
                  }
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_60._M_string_length,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  if (local_64 == 0) {
                    pcVar3 = "";
                    local_64 = CfdGetConfidentialTxOutIndex
                                         (local_30,(char *)local_28.ptr_,"",
                                          "76a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac",
                                          &local_3c);
                    local_78.data_ = local_78.data_ & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<CfdErrorCode,int>
                              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,
                               &local_64);
                    if ((char)local_60._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&local_78);
                      if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
                        pcVar3 = *(char **)local_60._M_string_length;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x90,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      if (local_78.data_ != (AssertHelperData *)0x0) {
                        bVar2 = testing::internal::IsTrue(true);
                        if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                          (**(code **)(*(long *)local_78.data_ + 8))();
                        }
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_60._M_string_length,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    local_78.data_ = local_78.data_ & 0xffffffff00000000;
                    testing::internal::CmpHelperEQ<int,unsigned_int>
                              ((internal *)&local_60,"0","index",(int *)&local_78,&local_3c);
                    if ((char)local_60._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&local_78);
                      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                        pcVar3 = "";
                      }
                      else {
                        pcVar3 = *(char **)local_60._M_string_length;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_70,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                 ,0x91,pcVar3);
                      testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                      testing::internal::AssertHelper::~AssertHelper(&local_70);
                      if (local_78.data_ != (AssertHelperData *)0x0) {
                        bVar2 = testing::internal::IsTrue(true);
                        if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                          (**(code **)(*(long *)local_78.data_ + 8))();
                        }
                      }
                    }
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&local_60._M_string_length,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    if (local_64 == 0) {
                      local_64 = CfdGetConfidentialTxOutIndex
                                           (local_30,(char *)local_28.ptr_,
                                            "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM",(char *)0x0,
                                            &local_3c);
                      local_78.data_ = local_78.data_ & 0xffffffff00000000;
                      testing::internal::CmpHelperEQ<CfdErrorCode,int>
                                ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78
                                 ,&local_64);
                      if ((char)local_60._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_78);
                        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                          pcVar3 = "";
                        }
                        else {
                          pcVar3 = *(char **)local_60._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_70,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                   ,0x98,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                        testing::internal::AssertHelper::~AssertHelper(&local_70);
                        if (local_78.data_ != (AssertHelperData *)0x0) {
                          bVar2 = testing::internal::IsTrue(true);
                          if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                            (**(code **)(*(long *)local_78.data_ + 8))();
                          }
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_60._M_string_length,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      local_78.data_._0_4_ = 1;
                      testing::internal::CmpHelperEQ<int,unsigned_int>
                                ((internal *)&local_60,"1","index",(int *)&local_78,&local_3c);
                      if ((char)local_60._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_78);
                        if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                          pcVar3 = "";
                        }
                        else {
                          pcVar3 = *(char **)local_60._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_70,kNonFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                   ,0x99,pcVar3);
                        testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
                        testing::internal::AssertHelper::~AssertHelper(&local_70);
                        if (local_78.data_ != (AssertHelperData *)0x0) {
                          bVar2 = testing::internal::IsTrue(true);
                          if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                            (**(code **)(*(long *)local_78.data_ + 8))();
                          }
                        }
                      }
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&local_60._M_string_length,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      if (local_64 == 0) {
                        pcVar3 = "";
                        local_64 = CfdGetConfidentialTxOutIndex
                                             (local_30,(char *)local_28.ptr_,"",
                                              "76a914fdd725970db682de970e7669646ed7afb8348ea188ac",
                                              &local_3c);
                        local_78.data_ = local_78.data_ & 0xffffffff00000000;
                        testing::internal::CmpHelperEQ<CfdErrorCode,int>
                                  ((internal *)&local_60,"kCfdSuccess","ret",
                                   (CfdErrorCode *)&local_78,&local_64);
                        if ((char)local_60._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_78);
                          if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
                            pcVar3 = *(char **)local_60._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_70,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                     ,0x9f,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_70);
                          if (local_78.data_ != (AssertHelperData *)0x0) {
                            bVar2 = testing::internal::IsTrue(true);
                            if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                              (**(code **)(*(long *)local_78.data_ + 8))();
                            }
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_60._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        local_78.data_._0_4_ = 1;
                        testing::internal::CmpHelperEQ<int,unsigned_int>
                                  ((internal *)&local_60,"1","index",(int *)&local_78,&local_3c);
                        if ((char)local_60._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_78);
                          if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                            pcVar3 = "";
                          }
                          else {
                            pcVar3 = *(char **)local_60._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_70,kNonFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                     ,0xa0,pcVar3);
                          testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_70);
                          if (local_78.data_ != (AssertHelperData *)0x0) {
                            bVar2 = testing::internal::IsTrue(true);
                            if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                              (**(code **)(*(long *)local_78.data_ + 8))();
                            }
                          }
                        }
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&local_60._M_string_length,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        if (local_64 == 0) {
                          local_64 = CfdGetConfidentialTxOutIndex
                                               (local_30,(char *)local_28.ptr_,(char *)0x0,
                                                (char *)0x0,&local_3c);
                          local_78.data_ = local_78.data_ & 0xffffffff00000000;
                          testing::internal::CmpHelperEQ<CfdErrorCode,int>
                                    ((internal *)&local_60,"kCfdSuccess","ret",
                                     (CfdErrorCode *)&local_78,&local_64);
                          if ((char)local_60._M_dataplus._M_p == '\0') {
                            testing::Message::Message((Message *)&local_78);
                            if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                              pcVar3 = "";
                            }
                            else {
                              pcVar3 = *(char **)local_60._M_string_length;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_70,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                       ,0xa6,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      (&local_70,(Message *)&local_78);
                            testing::internal::AssertHelper::~AssertHelper(&local_70);
                            if (local_78.data_ != (AssertHelperData *)0x0) {
                              bVar2 = testing::internal::IsTrue(true);
                              if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                                (**(code **)(*(long *)local_78.data_ + 8))();
                              }
                            }
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_60._M_string_length,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0);
                          local_78.data_._0_4_ = 2;
                          testing::internal::CmpHelperEQ<int,unsigned_int>
                                    ((internal *)&local_60,"2","index",(int *)&local_78,&local_3c);
                          if ((char)local_60._M_dataplus._M_p == '\0') {
                            testing::Message::Message((Message *)&local_78);
                            if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                              pcVar3 = "";
                            }
                            else {
                              pcVar3 = *(char **)local_60._M_string_length;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_70,kNonFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                       ,0xa7,pcVar3);
                            testing::internal::AssertHelper::operator=
                                      (&local_70,(Message *)&local_78);
                            testing::internal::AssertHelper::~AssertHelper(&local_70);
                            if (local_78.data_ != (AssertHelperData *)0x0) {
                              bVar2 = testing::internal::IsTrue(true);
                              if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                                (**(code **)(*(long *)local_78.data_ + 8))();
                              }
                            }
                          }
                          testing::internal::
                          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&local_60._M_string_length,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)0x0);
                          if (local_64 == 0) {
                            testing::internal::CmpHelperSTREQ
                                      ((internal *)&local_60,
                                       "\"020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000\""
                                       ,"tx_string",
                                       "020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
                                       ,(char *)local_28.ptr_);
                            if ((char)local_60._M_dataplus._M_p == '\0') {
                              testing::Message::Message((Message *)&local_78);
                              if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
                                pcVar3 = "";
                              }
                              else {
                                pcVar3 = *(char **)local_60._M_string_length;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_70,kNonFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                                         ,0xab,pcVar3);
                              testing::internal::AssertHelper::operator=
                                        (&local_70,(Message *)&local_78);
                              testing::internal::AssertHelper::~AssertHelper(&local_70);
                              if (local_78.data_ != (AssertHelperData *)0x0) {
                                bVar2 = testing::internal::IsTrue(true);
                                if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
                                  (**(code **)(*(long *)local_78.data_ + 8))();
                                }
                              }
                            }
                            testing::internal::
                            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)&local_60._M_string_length,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)0x0);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  local_64 = CfdGetLastErrorCode(local_30);
  if (local_64 != 0) {
    local_78.data_ = (AssertHelperData *)0x0;
    local_64 = CfdGetLastErrorMessage(local_30,(char **)&local_78);
    local_70.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_64);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xb2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      if (CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    pcVar3 = "";
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_60,"\"\"","str_buffer","",(char *)local_78.data_);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
        pcVar3 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xb3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      if (CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_78.data_);
    if (local_64 != 0) goto LAB_00294675;
  }
  local_64 = CfdGetConfidentialTxInIndex
                       (local_30,(char *)local_28.ptr_,
                        "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1",3,
                        &local_3c);
  local_78.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_60,"kCfdIllegalArgumentError","ret",(CfdErrorCode *)&local_78,
             &local_64);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xbc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_64 != 0) {
    if (local_64 != 1) goto LAB_00294675;
    local_64 = 0;
  }
  local_64 = CfdGetConfidentialTxOutIndex
                       (local_30,(char *)local_28.ptr_,(char *)0x0,
                        "76a914fdd825970db682de970e7669646ed7afb8348ea188ac",&local_3c);
  local_78.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_60,"kCfdIllegalArgumentError","ret",(CfdErrorCode *)&local_78,
             &local_64);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xc5,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_64 == 1) {
    local_64 = 0;
  }
LAB_00294675:
  local_64 = CfdGetLastErrorCode(local_30);
  if (local_64 != 0) {
    local_78.data_ = (AssertHelperData *)0x0;
    local_64 = CfdGetLastErrorMessage(local_30,(char **)&local_78);
    local_70.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<CfdErrorCode,int>
              ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_70,&local_64);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xcf,pcVar3);
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      if (CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_60,"\"Failed to parameter. search target is not found.\"",
               "str_buffer","Failed to parameter. search target is not found.",
               (char *)local_78.data_);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_70);
      if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
        pcVar3 = "";
      }
      else {
        pcVar3 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_18,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0xd0,pcVar3);
      testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_18);
      if (CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) != (long *)0x0))
        {
          (**(code **)(*(long *)CONCAT44(local_70.data_._4_4_,local_70.data_._0_4_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    CfdFreeStringBuffer((char *)local_78.data_);
  }
  if (local_28.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    CfdFreeStringBuffer((char *)local_28.ptr_);
  }
  local_64 = CfdFreeHandle(local_30);
  local_78.data_ = local_78.data_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<CfdErrorCode,int>
            ((internal *)&local_60,"kCfdSuccess","ret",(CfdErrorCode *)&local_78,&local_64);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_78);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0xda,pcVar3);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (local_78.data_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_78.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_78.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, CreateRawTransaction) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* tx_string = nullptr;
  char* tx_string2 = nullptr;
  int64_t satoshi;
  uint32_t index = 0;

  ret = CfdInitializeConfidentialTx(handle, 2, 0, &tx_string);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("0200000000000000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "7461b02405414d79e79a5050684a333c922c1136f4bdff5fb94b551394edebbd", 0,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000001bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffff0000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000002bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffff0000000000", tx_string);

    ret = CfdAddConfidentialTxIn(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 2,
      4294967295U, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff0000000000", tx_string);

    index = 0;
    ret = CfdGetConfidentialTxInIndex(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 1,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    satoshi = 100000000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "ef47c42d34de1b06a02212e8061323f50d5f02ceed202f1cb375932aa299f751",
      satoshi, nullptr, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ",
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff010151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac00000000", tx_string);

    satoshi = 1900500000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
      satoshi, nullptr, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM",
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac00000000", tx_string);

    satoshi = 500000;
    ret = CfdAddConfidentialTxOut(
      handle, tx_string, "6f1a4b6bd5571b5f08ab79c314dc6483f9b952af2f5ef206cd6f8e68eb1186f3",
      satoshi, nullptr, nullptr,
      nullptr, nullptr, &tx_string2);
    EXPECT_EQ(kCfdSuccess, ret);

    CfdFreeStringBuffer(tx_string);
    tx_string = tx_string2;
    tx_string2 = nullptr;
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "CTEw7oSCUWDfmfhCEdsB3gsG7D9b4xLCZEq71H8JxRFeBu7yQN3CbSF6qT6J4F7qji4bq1jVSdVcqvRJ", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "", "76a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(0, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "2dxZw5iVZ6Pmqoc5Vn8gkUWDGB5dXuMBCmM", NULL,
      &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, "", "76a914fdd725970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(1, index);
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, NULL, NULL, &index);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_EQ(2, index);
  }

  if (ret == kCfdSuccess) {
    EXPECT_STREQ("020000000003bdebed9413554bb95fffbdf436112c923c334a6850509ae7794d410524b061740000000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140100000000ffffffffc16d35d26589dfd54634181aa4a290cb9e06a716ea68620be05fbc46f1e197140200000000ffffffff030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef010000000005f5e10003a630456ab6d50b57981e085abced70e2816289ae2b49a44c2f471b205134c12b1976a914d08f5ba8874d36cf97d19379b370f1f23ba36d5888ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f010000000071475420001976a914fdd725970db682de970e7669646ed7afb8348ea188ac01f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000", tx_string);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxInIndex(
      handle, tx_string, "1497e1f146bc5fe00b6268ea16a7069ecb90a2a41a183446d5df8965d2356dc1", 3,
      &index);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      ret = kCfdSuccess;
    }
  }

  if (ret == kCfdSuccess) {
    ret = CfdGetConfidentialTxOutIndex(
      handle, tx_string, NULL, "76a914fdd825970db682de970e7669646ed7afb8348ea188ac", &index);
    EXPECT_EQ(kCfdIllegalArgumentError, ret);
    if (ret == kCfdIllegalArgumentError) {
      ret = kCfdSuccess;
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("Failed to parameter. search target is not found.", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  if (tx_string != nullptr) {
    CfdFreeStringBuffer(tx_string);
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}